

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O3

int isRootDirectoryRecord(uchar *p)

{
  uint uVar1;
  
  uVar1 = 0;
  if (((((0xdc < (byte)(*p + 0xbb)) && (p[2] == p[9])) && (p[3] == p[8])) &&
      (((p[4] == p[7] && (p[5] == p[6])) &&
       ((p[10] == p[0x11] && ((p[0xb] == p[0x10] && (p[0xc] == p[0xf])))))))) &&
     ((p[0xd] == p[0xe] &&
      (((((p[0x19] & 0x8e) == 2 && (p[0x1c] == p[0x1f])) && (p[0x1d] == p[0x1e])) &&
       (p[0x20] == '\x01')))))) {
    uVar1 = (uint)(p[0x21] == '\0');
  }
  return uVar1;
}

Assistant:

static int
isRootDirectoryRecord(const unsigned char *p) {
	int flags;

	/* ECMA119/ISO9660 requires that the root directory record be _exactly_ 34 bytes.
	 * However, we've seen images that have root directory records up to 68 bytes. */
	if (p[DR_length_offset] < 34 || p[DR_length_offset] > 68) {
		return (0);
	}

	/* The root directory location must be a 7.3.3 32-bit integer. */
	if (!isValid733Integer(p + DR_extent_offset)) {
		return (0);
	}

	/* The root directory size must be a 7.3.3 integer. */
	if (!isValid733Integer(p + DR_size_offset)) {
		return (0);
	}

	/* According to the standard, certain bits must be one or zero:
	 * Bit 1: must be 1 (this is a directory)
	 * Bit 2: must be 0 (not an associated file)
	 * Bit 3: must be 0 (doesn't use extended attribute record)
	 * Bit 7: must be 0 (final directory record for this file)
	 */
	flags = p[DR_flags_offset];
	if ((flags & 0x8E) != 0x02) {
		return (0);
	}

	/* Volume sequence number must be a 7.2.3 integer. */
	if (!isValid723Integer(p + DR_volume_sequence_number_offset)) {
		return (0);
	}

	/* Root directory name is a single zero byte... */
	if (p[DR_name_len_offset] != 1 || p[DR_name_offset] != 0) {
		return (0);
	}

	/* Nothing looked wrong, so let's accept it. */
	return (1);
}